

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::checkInFlightQueriesForDisconnect(CommonCore *this)

{
  _Head_base<0UL,_helics::fileops::JsonMapBuilder,_false> *this_00;
  _Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
  *this_01;
  pointer ptVar1;
  pointer pAVar2;
  pointer pAVar3;
  bool bVar4;
  pointer ptVar5;
  int ii;
  long lVar6;
  long lVar7;
  string str;
  string local_50;
  
  ptVar5 = (this->mapBuilders).
           super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (this->mapBuilders).
           super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ptVar5 == ptVar1) {
      return;
    }
    this_00 = &(ptVar5->
               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
               ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>;
    bVar4 = fileops::JsonMapBuilder::isCompleted(&this_00->_M_head_impl);
    if (bVar4) break;
    bVar4 = fileops::JsonMapBuilder::clearComponents(&this_00->_M_head_impl);
    if (bVar4) {
      this_01 = &(ptVar5->
                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                 ).
                 super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                 .
                 super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
      ;
      fileops::JsonMapBuilder::generate_abi_cxx11_(&local_50,&this_00->_M_head_impl);
      lVar7 = 0;
      lVar6 = 0;
      while( true ) {
        pAVar2 = (ptVar5->
                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                 ).
                 super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                 .
                 super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pAVar3 = *(pointer *)
                  ((long)&(ptVar5->
                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          ).
                          super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          .
                          super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                          ._M_impl.super__Vector_impl_data + 8);
        if ((int)(((long)pAVar3 - (long)pAVar2) / 0xb8) + -1 <= lVar6) break;
        if (*(int *)((long)&(pAVar2->payload).buffer + lVar7 + 0xffffffffffffffd0U) ==
            (this->super_BrokerBase).global_broker_id_local.gid) {
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(&this->activeQueries,
                            *(int *)((long)&(pAVar2->payload).buffer + lVar7 + 0xffffffffffffffc4U),
                            &local_50);
        }
        else {
          SmallBuffer::operator=((SmallBuffer *)((long)&(pAVar2->payload).buffer + lVar7),&local_50)
          ;
          routeMessage(this,(ActionMessage *)
                            ((long)&(((this_01->_M_head_impl).
                                      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->payload).buffer +
                            lVar7 + -0x40));
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0xb8;
      }
      if (pAVar3[-1].dest_id.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(&this->activeQueries,pAVar3[-1].messageID,&local_50);
      }
      else {
        SmallBuffer::operator=(&pAVar3[-1].payload,&local_50);
        routeMessage(this,*(pointer *)
                           ((long)&(ptVar5->
                                   super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                   ).
                                   super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                   .
                                   super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                   ._M_head_impl.
                                   super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                   ._M_impl.super__Vector_impl_data + 8) + -1);
      }
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
                (&this_01->_M_head_impl);
      if ((ptVar5->
          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
          ).
          super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
          .super__Tuple_impl<2UL,_helics::QueryReuse>.
          super__Head_base<2UL,_helics::QueryReuse,_false>._M_head_impl == DISABLED) {
        fileops::JsonMapBuilder::reset(&this_00->_M_head_impl);
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    ptVar5 = ptVar5 + 1;
  }
  return;
}

Assistant:

void CommonCore::checkInFlightQueriesForDisconnect()
{
    for (auto& builderData : mapBuilders) {
        auto& builder = std::get<0>(builderData);
        auto& requesters = std::get<1>(builderData);
        if (builder.isCompleted()) {
            return;
        }
        if (builder.clearComponents()) {
            auto str = builder.generate();
            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(builderData) == QueryReuse::DISABLED) {
                builder.reset();
            }
        }
    }
}